

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextFile.cpp
# Opt level: O0

bool __thiscall asl::TextFile::append(TextFile *this,String *s)

{
  uint uVar1;
  int iVar2;
  char *__ptr;
  size_t sVar3;
  int in_EDX;
  String *s_local;
  TextFile *this_local;
  
  if (((this->super_File)._file == (FILE *)0x0) &&
     (uVar1 = open(this,(char *)0x2,in_EDX), (uVar1 & 1) == 0)) {
    return false;
  }
  __ptr = asl::String::operator*(s);
  iVar2 = asl::String::length(s);
  sVar3 = fwrite(__ptr,1,(long)iVar2,(FILE *)(this->super_File)._file);
  iVar2 = asl::String::length(s);
  return iVar2 <= (int)sVar3;
}

Assistant:

bool TextFile::append(const String& s)
{
	if (!_file && !open(APPEND))
		return false;
	return (int)fwrite(*s, 1, s.length(), _file) >= s.length();
}